

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

long delegation(OperationConfig *config,char *str)

{
  int iVar1;
  char *str_local;
  OperationConfig *config_local;
  
  iVar1 = curl_strequal("none",str);
  if (iVar1 == 0) {
    iVar1 = curl_strequal("policy",str);
    if (iVar1 == 0) {
      iVar1 = curl_strequal("always",str);
      if (iVar1 == 0) {
        warnf(config->global,"unrecognized delegation method \'%s\', using none\n",str);
        config_local = (OperationConfig *)0x0;
      }
      else {
        config_local = (OperationConfig *)0x2;
      }
    }
    else {
      config_local = (OperationConfig *)0x1;
    }
  }
  else {
    config_local = (OperationConfig *)0x0;
  }
  return (long)config_local;
}

Assistant:

long delegation(struct OperationConfig *config, char *str)
{
  if(curl_strequal("none", str))
    return CURLGSSAPI_DELEGATION_NONE;
  if(curl_strequal("policy", str))
    return CURLGSSAPI_DELEGATION_POLICY_FLAG;
  if(curl_strequal("always", str))
    return CURLGSSAPI_DELEGATION_FLAG;

  warnf(config->global, "unrecognized delegation method '%s', using none\n",
        str);

  return CURLGSSAPI_DELEGATION_NONE;
}